

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbidata.cpp
# Opt level: O0

void __thiscall
icu_63::RBBIDataWrapper::RBBIDataWrapper(RBBIDataWrapper *this,UDataMemory *udm,UErrorCode *status)

{
  DataHeader *pDVar1;
  UBool UVar2;
  uint uVar3;
  RBBIDataHeader *rbbidh;
  char *dataAsBytes;
  int32_t headerSize;
  DataHeader *dh;
  UErrorCode *status_local;
  UDataMemory *udm_local;
  RBBIDataWrapper *this_local;
  
  UnicodeString::UnicodeString(&this->fRuleString);
  init0(this);
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    pDVar1 = udm->pHeader;
    uVar3 = (uint)(pDVar1->dataHeader).headerSize;
    if (((((uVar3 < 0x14) || ((pDVar1->info).isBigEndian != '\0')) ||
         ((pDVar1->info).charsetFamily != '\0')) ||
        (((pDVar1->info).dataFormat[0] != 'B' || ((pDVar1->info).dataFormat[1] != 'r')))) ||
       (((pDVar1->info).dataFormat[2] != 'k' ||
        (((pDVar1->info).dataFormat[3] != ' ' ||
         (UVar2 = isDataVersionAcceptable((pDVar1->info).formatVersion), UVar2 == '\0')))))) {
      *status = U_INVALID_FORMAT_ERROR;
    }
    else {
      init(this,(EVP_PKEY_CTX *)((pDVar1->info).dataFormat + (long)(int)uVar3 + -0xc));
      this->fUDataMem = udm;
    }
  }
  return;
}

Assistant:

RBBIDataWrapper::RBBIDataWrapper(UDataMemory* udm, UErrorCode &status) {
    init0();
    if (U_FAILURE(status)) {
        return;
    }
    const DataHeader *dh = udm->pHeader;
    int32_t headerSize = dh->dataHeader.headerSize;
    if (  !(headerSize >= 20 &&
            dh->info.isBigEndian == U_IS_BIG_ENDIAN &&
            dh->info.charsetFamily == U_CHARSET_FAMILY &&
            dh->info.dataFormat[0] == 0x42 &&  // dataFormat="Brk "
            dh->info.dataFormat[1] == 0x72 &&
            dh->info.dataFormat[2] == 0x6b &&
            dh->info.dataFormat[3] == 0x20 &&
            isDataVersionAcceptable(dh->info.formatVersion))
        ) {
        status = U_INVALID_FORMAT_ERROR;
        return;
    }
    const char *dataAsBytes = reinterpret_cast<const char *>(dh);
    const RBBIDataHeader *rbbidh = reinterpret_cast<const RBBIDataHeader *>(dataAsBytes + headerSize);
    init(rbbidh, status);
    fUDataMem = udm;
}